

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometrybasic.hpp
# Opt level: O2

bool __thiscall BasicPrimitive::intersect(BasicPrimitive *this,Ray *ray,Hit *result)

{
  vec2f vVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float fVar4;
  float fVar5;
  point pVar6;
  float t;
  float local_6c;
  undefined3 uStack_67;
  undefined4 local_64;
  undefined4 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 local_30;
  float local_28;
  
  iVar3 = (*(this->super_Primitive)._vptr_Primitive[3])(this,ray,&local_6c);
  if (SUB41(iVar3,0) != false) {
    pVar6 = Ray::atParam(ray,local_6c);
    fVar4 = pVar6.z;
    local_30 = pVar6._0_8_;
    local_28 = fVar4;
    (*(this->super_Primitive)._vptr_Primitive[4])(this,&local_30);
    fVar5 = fVar4;
    local_48 = extraout_XMM0_Da;
    uStack_44 = extraout_XMM0_Db;
    (*(this->super_Primitive)._vptr_Primitive[5])(this,&local_30);
    local_58 = extraout_XMM0_Da_00;
    uStack_54 = extraout_XMM0_Db_00;
    (*(this->super_Primitive)._vptr_Primitive[6])(this,&local_30);
    local_64 = (undefined4)local_30;
    uStack_60 = (undefined4)((ulong)local_30 >> 0x20);
    uVar2 = uStack_60;
    result->hit = true;
    uStack_60._0_1_ = (undefined1)((ulong)local_30 >> 0x20);
    *(ulong *)&result->field_0x1 = CONCAT17((undefined1)uStack_60,CONCAT43(local_64,uStack_67));
    (result->p).y = (float)uVar2;
    (result->p).z = local_28;
    (result->Ns).x = (float)local_48;
    (result->Ns).y = (float)uStack_44;
    (result->Ns).z = fVar4;
    (result->Ng).x = (float)local_58;
    (result->Ng).y = (float)uStack_54;
    (result->Ng).z = fVar5;
    vVar1.y = extraout_XMM0_Db_01;
    vVar1.x = extraout_XMM0_Da_01;
    result->uv = vVar1;
    (result->dpdu).x = 0.0;
    (result->dpdu).y = 0.0;
    *(undefined8 *)&(result->dpdu).z = 0;
    (result->dpdv).y = 0.0;
    (result->dpdv).z = 0.0;
  }
  return SUB41(iVar3,0);
}

Assistant:

bool BasicPrimitive::intersect(const Ray& ray, Hit* result) const
{
	float t;
	bool b = intersect(ray, t);
	if (!b) return false;
	point p = ray.atParam(t);
	*result = Hit(p, Ns(p), Ng(p), uv(p));
	return true;
}